

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixedEnvelopes.cpp
# Opt level: O0

void IsoSpec::reorder_array<double>(double *arr,size_t *order,size_t size,bool can_destroy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  byte in_CL;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t ii;
  size_t *order_c;
  ulong local_30;
  void *local_10;
  
  local_10 = in_RSI;
  if ((in_CL & 1) == 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RDX;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    local_10 = operator_new__(uVar2);
    memcpy(local_10,in_RSI,in_RDX << 3);
  }
  for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
    while (*(ulong *)((long)local_10 + local_30 * 8) != local_30) {
      std::swap<double>((double *)(in_RDI + local_30 * 8),
                        (double *)(in_RDI + *(long *)((long)local_10 + local_30 * 8) * 8));
      std::swap<unsigned_long>
                ((unsigned_long *)((long)local_10 + *(long *)((long)local_10 + local_30 * 8) * 8),
                 (unsigned_long *)((long)local_10 + local_30 * 8));
    }
  }
  if (((in_CL & 1) == 0) && (local_10 != (void *)0x0)) {
    operator_delete__(local_10);
  }
  return;
}

Assistant:

void reorder_array(T* arr, size_t* order, size_t size, bool can_destroy = false)
{
    if(!can_destroy)
    {
        size_t* order_c = new size_t[size];
        memcpy(order_c, order, sizeof(size_t)*size);
        order = order_c;
    }

    for(size_t ii = 0; ii < size; ii++)
        while(order[ii] != ii)
        {
            std::swap(arr[ii], arr[order[ii]]);
            std::swap(order[order[ii]], order[ii]);
        }

    if(!can_destroy)
        delete[] order;
}